

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote.cpp
# Opt level: O1

void __thiscall remote::Handle::ParseMaps(Handle *this)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  istream *piVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  string pathname;
  string device;
  string memorySpace;
  string inode;
  string offset;
  string permissions;
  string line;
  MapModuleMemoryRegion region;
  stringstream ss;
  istringstream iss;
  ifstream maps;
  char *local_6c0;
  long local_6b8;
  char local_6b0 [16];
  undefined1 *local_6a0;
  long local_698;
  undefined1 local_690 [16];
  undefined1 *local_680;
  undefined8 local_678;
  undefined1 local_670 [16];
  undefined1 *local_660;
  undefined8 local_658;
  undefined1 local_650 [16];
  char *local_640;
  long local_638;
  char local_630 [16];
  char *local_620;
  long local_618;
  char local_610 [16];
  char *local_600;
  undefined8 local_5f8;
  char local_5f0 [16];
  undefined1 *local_5e0;
  ulong local_5d8;
  undefined1 local_5d0 [16];
  vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_> *local_5c0;
  undefined1 local_5b8 [48];
  _Alloc_hider local_588;
  size_type local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  _Alloc_hider local_568;
  size_type local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  long *local_540;
  long local_538;
  long local_530;
  long lStack_528;
  uint auStack_518 [22];
  ios_base local_4c0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8 [3];
  ios_base local_340 [264];
  long local_238 [65];
  
  local_5c0 = &this->regions;
  std::vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>::
  _M_erase_at_end(local_5c0,
                  (this->regions).
                  super__Vector_base<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  std::operator+(local_3b8,"/proc/",&this->pidStr);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_3b8);
  plVar6 = plVar3 + 2;
  if ((long *)*plVar3 == plVar6) {
    local_530 = *plVar6;
    lStack_528 = plVar3[3];
    local_540 = &local_530;
  }
  else {
    local_530 = *plVar6;
    local_540 = (long *)*plVar3;
  }
  local_538 = plVar3[1];
  *plVar3 = (long)plVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::ifstream::ifstream(local_238,(string *)&local_540,_S_in);
  if (local_540 != &local_530) {
    operator_delete(local_540);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
    operator_delete(local_3b8[0]._M_dataplus._M_p);
  }
  local_5e0 = local_5d0;
  local_5d8 = 0;
  local_5d0[0] = 0;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_5e0,cVar1);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_3b8,(string *)&local_5e0,_S_in);
    local_660 = local_650;
    local_658 = 0;
    local_650[0] = 0;
    local_600 = local_5f0;
    local_5f8 = 0;
    local_5f0[0] = '\0';
    local_620 = local_610;
    local_618 = 0;
    local_610[0] = '\0';
    local_680 = local_670;
    local_678 = 0;
    local_670[0] = 0;
    local_640 = local_630;
    local_638 = 0;
    local_630[0] = '\0';
    piVar4 = std::operator>>((istream *)local_3b8,(string *)&local_660);
    piVar4 = std::operator>>(piVar4,(string *)&local_600);
    piVar4 = std::operator>>(piVar4,(string *)&local_620);
    piVar4 = std::operator>>(piVar4,(string *)&local_680);
    piVar4 = std::operator>>(piVar4,(string *)&local_640);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
      local_6a0 = local_690;
      local_698 = 0;
      local_690[0] = 0;
      if (local_5d8 != 0) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          std::__cxx11::string::substr((ulong)&local_540,(ulong)&local_5e0);
          iVar2 = std::__cxx11::string::compare((char *)&local_540);
          if (local_540 != &local_530) {
            operator_delete(local_540);
          }
          if ((iVar2 == 0) && (lVar7 = lVar7 + 1, lVar7 == 5)) {
            std::__cxx11::string::substr((ulong)&local_540,(ulong)&local_5e0);
            lVar7 = std::__cxx11::string::find_first_not_of((char)(stringstream *)&local_540,0x20);
            if (local_540 != &local_530) {
              operator_delete(local_540);
            }
            if (lVar7 == -1) {
              local_698 = 0;
              *local_6a0 = 0;
            }
            else {
              std::__cxx11::string::substr((ulong)&local_540,(ulong)&local_5e0);
              std::__cxx11::string::operator=((string *)&local_6a0,(string *)&local_540);
              if (local_540 != &local_530) {
                operator_delete(local_540);
              }
            }
            lVar7 = 5;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < local_5d8);
      }
      local_588._M_p = (pointer)&local_578;
      local_580 = 0;
      local_578._M_local_buf[0] = '\0';
      local_568._M_p = (pointer)&local_558;
      local_560 = 0;
      local_558._M_local_buf[0] = '\0';
      lVar7 = std::__cxx11::string::find((char)&local_660,0x2d);
      lVar5 = std::__cxx11::string::find((char)&local_680,0x3a);
      std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
      iVar2 = (int)(stringstream *)&local_540;
      if (lVar7 != -1) {
        *(uint *)((long)auStack_518 + *(long *)(local_530 + -0x18)) =
             *(uint *)((long)auStack_518 + *(long *)(local_530 + -0x18)) & 0xffffffb5 | 8;
        std::__cxx11::string::substr((ulong)&local_6c0,(ulong)&local_660);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_530,local_6c0,local_6b8);
        if (local_6c0 != local_6b0) {
          operator_delete(local_6c0);
        }
        std::istream::_M_extract<unsigned_long>((ulong *)&local_540);
        std::ios::clear((int)local_540[-3] + iVar2);
        *(uint *)((long)auStack_518 + *(long *)(local_530 + -0x18)) =
             *(uint *)((long)auStack_518 + *(long *)(local_530 + -0x18)) & 0xffffffb5 | 8;
        std::__cxx11::string::substr((ulong)&local_6c0,(ulong)&local_660);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_530,local_6c0,local_6b8);
        if (local_6c0 != local_6b0) {
          operator_delete(local_6c0);
        }
        std::istream::_M_extract<unsigned_long>((ulong *)&local_540);
        std::ios::clear((int)local_540[-3] + iVar2);
      }
      if (lVar5 != -1) {
        *(uint *)((long)auStack_518 + *(long *)(local_530 + -0x18)) =
             *(uint *)((long)auStack_518 + *(long *)(local_530 + -0x18)) & 0xffffffb5 | 8;
        std::__cxx11::string::substr((ulong)&local_6c0,(ulong)&local_680);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_530,local_6c0,local_6b8);
        if (local_6c0 != local_6b0) {
          operator_delete(local_6c0);
        }
        std::operator>>((istream *)&local_540,local_5b8 + 0x20);
        std::ios::clear((int)local_540[-3] + iVar2);
        *(uint *)((long)auStack_518 + *(long *)(local_530 + -0x18)) =
             *(uint *)((long)auStack_518 + *(long *)(local_530 + -0x18)) & 0xffffffb5 | 8;
        std::__cxx11::string::substr((ulong)&local_6c0,(ulong)&local_680);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_530,local_6c0,local_6b8);
        if (local_6c0 != local_6b0) {
          operator_delete(local_6c0);
        }
        std::operator>>((istream *)&local_540,local_5b8 + 0x21);
        std::ios::clear((int)local_540[-3] + iVar2);
      }
      *(uint *)((long)auStack_518 + *(long *)(local_530 + -0x18)) =
           *(uint *)((long)auStack_518 + *(long *)(local_530 + -0x18)) & 0xffffffb5 | 8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_530,local_620,local_618);
      std::istream::_M_extract<unsigned_long>((ulong *)&local_540);
      std::ios::clear((int)local_540[-3] + iVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_530,local_640,local_638);
      std::istream::_M_extract<unsigned_long>((ulong *)&local_540);
      local_5b8[0x10] = *local_600 == 'r';
      local_5b8[0x11] = local_600[1] == 'w';
      local_5b8[0x12] = local_600[2] == 'x';
      local_5b8[0x13] = local_600[3] != '-';
      if (local_698 != 0) {
        std::__cxx11::string::_M_assign((string *)&local_588);
        lVar7 = std::__cxx11::string::rfind((char)&local_6a0,0x2f);
        if (lVar7 != -1) {
          std::__cxx11::string::substr((ulong)&local_6c0,(ulong)&local_6a0);
          std::__cxx11::string::operator=((string *)&local_568,(string *)&local_6c0);
          if (local_6c0 != local_6b0) {
            operator_delete(local_6c0);
          }
        }
      }
      std::vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>::
      push_back(local_5c0,(value_type *)local_5b8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_540);
      std::ios_base::~ios_base(local_4c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_568._M_p != &local_558) {
        operator_delete(local_568._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_p != &local_578) {
        operator_delete(local_588._M_p);
      }
      if (local_6a0 != local_690) {
        operator_delete(local_6a0);
      }
    }
    if (local_640 != local_630) {
      operator_delete(local_640);
    }
    if (local_680 != local_670) {
      operator_delete(local_680);
    }
    if (local_620 != local_610) {
      operator_delete(local_620);
    }
    if (local_600 != local_5f0) {
      operator_delete(local_600);
    }
    if (local_660 != local_650) {
      operator_delete(local_660);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
    std::ios_base::~ios_base(local_340);
  }
  if (local_5e0 != local_5d0) {
    operator_delete(local_5e0);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void Handle::ParseMaps() {
        regions.clear();

        std::ifstream maps("/proc/" + pidStr + "/maps");

        std::string line;
        while (std::getline(maps, line)) {
            std::istringstream iss(line);
            std::string memorySpace, permissions, offset, device, inode;
            if (iss >> memorySpace >> permissions >> offset >> device >> inode) {
                std::string pathname;

                for(size_t ls = 0, i = 0; i < line.length(); i++) {
                    if(line.substr(i, 1).compare(" ") == 0) {
                        ls++;

                        if(ls == 5) {
                            size_t begin = line.substr(i, line.size()).find_first_not_of(' ');

                            if(begin != -1) {
                                pathname = line.substr(begin + i, line.size());
                            } else {
                                pathname.clear();
                            }
                        }
                    }
                }

                MapModuleMemoryRegion region;

                size_t memorySplit = memorySpace.find_first_of('-');
                size_t deviceSplit = device.find_first_of(':');

                std::stringstream ss;

                if(memorySplit != -1) {
                    ss << std::hex << memorySpace.substr(0, memorySplit);
                    ss >> region.start;
                    ss.clear();
                    ss << std::hex << memorySpace.substr(memorySplit + 1, memorySpace.size());
                    ss >> region.end;
                    ss.clear();
                }

                if(deviceSplit != -1) {
                    ss << std::hex << device.substr(0, deviceSplit);
                    ss >> region.deviceMajor;
                    ss.clear();
                    ss << std::hex << device.substr(deviceSplit + 1, device.size());
                    ss >> region.deviceMinor;
                    ss.clear();
                }

                ss << std::hex << offset;
                ss >> region.offset;
                ss.clear();
                ss << inode;
                ss >> region.inodeFileNumber;

                region.readable = (permissions[0] == 'r');
                region.writable = (permissions[1] == 'w');
                region.executable = (permissions[2] == 'x');
                region.shared = (permissions[3] != '-');

                if(!pathname.empty()) {
                    region.pathname = pathname;

                    size_t fileNameSplit = pathname.find_last_of('/');

                    if(fileNameSplit != -1) {
                        region.filename = pathname.substr(fileNameSplit + 1, pathname.size());
                    }
                }

                regions.push_back(region);
            }
        }
    }